

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::DiscMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [32];
  uint uVar11;
  undefined4 uVar12;
  RayHitK<4> *pRVar13;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar39;
  float fVar40;
  undefined1 auVar36 [16];
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar42 [64];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [64];
  float fVar48;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [64];
  float fVar53;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar62 [64];
  undefined1 auVar66 [16];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  void *local_1b0;
  RTCRayQueryContext *local_1a8;
  RayHitK<4> *local_1a0;
  undefined1 (*local_198) [16];
  undefined4 local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  float local_128 [4];
  float local_118 [4];
  float local_108 [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  ulong uVar14;
  undefined1 auVar38 [64];
  undefined1 auVar67 [64];
  
  pSVar6 = context->scene;
  uVar14 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar7->time_range).lower;
  fVar1 = pGVar7->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar7->time_range).upper - fVar1));
  auVar27 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar27 = vminss_avx(auVar27,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar27 = vmaxss_avx(ZEXT816(0) << 0x20,auVar27);
  fVar1 = fVar1 - auVar27._0_4_;
  lVar15 = *(long *)&pGVar7[2].numPrimitives;
  lVar16 = (long)(int)auVar27._0_4_ * 0x38;
  lVar8 = *(long *)(lVar15 + lVar16);
  lVar9 = *(long *)(lVar15 + 0x10 + lVar16);
  auVar27 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar14);
  uVar17 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar28 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar17);
  uVar18 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar5 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar18);
  uVar19 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar36 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar19);
  auVar21 = vunpcklps_avx(auVar27,auVar5);
  auVar25 = vunpckhps_avx(auVar27,auVar5);
  auVar27 = vunpcklps_avx(auVar28,auVar36);
  auVar26 = vunpckhps_avx(auVar28,auVar36);
  auVar29 = vunpcklps_avx(auVar21,auVar27);
  auVar21 = vunpckhps_avx(auVar21,auVar27);
  auVar59 = vunpcklps_avx(auVar25,auVar26);
  lVar8 = *(long *)(lVar15 + 0x38 + lVar16);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar16);
  auVar27 = *(undefined1 (*) [16])(lVar8 + uVar14 * lVar15);
  auVar28 = *(undefined1 (*) [16])(lVar8 + uVar17 * lVar15);
  auVar5 = *(undefined1 (*) [16])(lVar8 + uVar18 * lVar15);
  auVar36 = *(undefined1 (*) [16])(lVar8 + lVar15 * uVar19);
  auVar60 = vunpcklps_avx(auVar27,auVar5);
  auVar32 = vunpckhps_avx(auVar27,auVar5);
  auVar27 = vunpcklps_avx(auVar28,auVar36);
  auVar34 = vunpckhps_avx(auVar28,auVar36);
  auVar36 = vunpcklps_avx(auVar60,auVar27);
  auVar28 = vunpckhps_avx(auVar60,auVar27);
  auVar60 = vunpcklps_avx(auVar32,auVar34);
  auVar27 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar5 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar58._8_4_ = 0x3f800000;
  auVar58._0_8_ = 0x3f8000003f800000;
  auVar58._12_4_ = 0x3f800000;
  fVar20 = auVar27._0_4_;
  fVar22 = auVar27._4_4_;
  fVar23 = auVar27._8_4_;
  fVar24 = auVar27._12_4_;
  fVar48 = auVar5._0_4_;
  fVar50 = auVar5._4_4_;
  fVar51 = auVar5._8_4_;
  fVar52 = auVar5._12_4_;
  auVar27._0_4_ = fVar48 * auVar29._0_4_ + fVar20 * auVar36._0_4_;
  auVar27._4_4_ = fVar50 * auVar29._4_4_ + fVar22 * auVar36._4_4_;
  auVar27._8_4_ = fVar51 * auVar29._8_4_ + fVar23 * auVar36._8_4_;
  auVar27._12_4_ = fVar52 * auVar29._12_4_ + fVar24 * auVar36._12_4_;
  auVar31._0_4_ = fVar20 * auVar28._0_4_ + fVar48 * auVar21._0_4_;
  auVar31._4_4_ = fVar22 * auVar28._4_4_ + fVar50 * auVar21._4_4_;
  auVar31._8_4_ = fVar23 * auVar28._8_4_ + fVar51 * auVar21._8_4_;
  auVar31._12_4_ = fVar24 * auVar28._12_4_ + fVar52 * auVar21._12_4_;
  auVar30._0_4_ = fVar20 * auVar60._0_4_ + fVar48 * auVar59._0_4_;
  auVar30._4_4_ = fVar22 * auVar60._4_4_ + fVar50 * auVar59._4_4_;
  auVar30._8_4_ = fVar23 * auVar60._8_4_ + fVar51 * auVar59._8_4_;
  auVar30._12_4_ = fVar24 * auVar60._12_4_ + fVar52 * auVar59._12_4_;
  local_f8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar12 = *(undefined4 *)(ray + k * 4);
  auVar36._4_4_ = uVar12;
  auVar36._0_4_ = uVar12;
  auVar36._8_4_ = uVar12;
  auVar36._12_4_ = uVar12;
  auVar36 = vsubps_avx(auVar27,auVar36);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar28._4_4_ = uVar12;
  auVar28._0_4_ = uVar12;
  auVar28._8_4_ = uVar12;
  auVar28._12_4_ = uVar12;
  auVar21 = vsubps_avx(auVar31,auVar28);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar29._4_4_ = uVar12;
  auVar29._0_4_ = uVar12;
  auVar29._8_4_ = uVar12;
  auVar29._12_4_ = uVar12;
  auVar29 = vsubps_avx(auVar30,auVar29);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar27 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar28 = vshufps_avx(auVar27,auVar27,0);
  auVar27 = vrcpps_avx(auVar28);
  fVar61 = auVar27._0_4_;
  auVar60._0_4_ = fVar61 * auVar28._0_4_;
  fVar63 = auVar27._4_4_;
  auVar60._4_4_ = fVar63 * auVar28._4_4_;
  fVar64 = auVar27._8_4_;
  auVar60._8_4_ = fVar64 * auVar28._8_4_;
  fVar65 = auVar27._12_4_;
  auVar60._12_4_ = fVar65 * auVar28._12_4_;
  auVar27 = vsubps_avx(auVar58,auVar60);
  fVar53 = auVar29._0_4_;
  fVar55 = auVar29._4_4_;
  fVar56 = auVar29._8_4_;
  fVar57 = auVar29._12_4_;
  fVar43 = auVar21._0_4_;
  fVar45 = auVar21._4_4_;
  fVar46 = auVar21._8_4_;
  fVar47 = auVar21._12_4_;
  fVar35 = auVar36._0_4_;
  fVar39 = auVar36._4_4_;
  fVar40 = auVar36._8_4_;
  fVar41 = auVar36._12_4_;
  local_138._0_4_ =
       (fVar35 * fVar1 + fVar43 * fVar2 + fVar53 * fVar3) * (fVar61 + fVar61 * auVar27._0_4_);
  local_138._4_4_ =
       (fVar39 * fVar1 + fVar45 * fVar2 + fVar55 * fVar3) * (fVar63 + fVar63 * auVar27._4_4_);
  local_138._8_4_ =
       (fVar40 * fVar1 + fVar46 * fVar2 + fVar56 * fVar3) * (fVar64 + fVar64 * auVar27._8_4_);
  local_138._12_4_ =
       (fVar41 * fVar1 + fVar47 * fVar2 + fVar57 * fVar3) * (fVar65 + fVar65 * auVar27._12_4_);
  auVar62 = ZEXT1664(local_138);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar59._4_4_ = uVar12;
  auVar59._0_4_ = uVar12;
  auVar59._8_4_ = uVar12;
  auVar59._12_4_ = uVar12;
  auVar27 = vcmpps_avx(auVar59,local_138,2);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar66._4_4_ = uVar12;
  auVar66._0_4_ = uVar12;
  auVar66._8_4_ = uVar12;
  auVar66._12_4_ = uVar12;
  auVar67 = ZEXT1664(auVar66);
  auVar28 = vcmpps_avx(local_138,auVar66,2);
  auVar27 = vandps_avx(auVar28,auVar27);
  auVar28 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar28 = vpcmpgtd_avx(auVar28,_DAT_01f7fcf0);
  auVar59 = auVar28 & auVar27;
  if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar59[0xf] < '\0') {
    auVar27 = vandps_avx(auVar27,auVar28);
    auVar28 = vunpckhps_avx(auVar25,auVar26);
    auVar25 = vunpckhps_avx(auVar32,auVar34);
    fVar20 = fVar48 * auVar28._0_4_ + fVar20 * auVar25._0_4_;
    fVar22 = fVar50 * auVar28._4_4_ + fVar22 * auVar25._4_4_;
    fVar23 = fVar51 * auVar28._8_4_ + fVar23 * auVar25._8_4_;
    fVar24 = fVar52 * auVar28._12_4_ + fVar24 * auVar25._12_4_;
    auVar25._0_4_ = local_138._0_4_ * fVar1;
    auVar25._4_4_ = local_138._4_4_ * fVar1;
    auVar25._8_4_ = local_138._8_4_ * fVar1;
    auVar25._12_4_ = local_138._12_4_ * fVar1;
    auVar32._0_4_ = local_138._0_4_ * fVar2;
    auVar32._4_4_ = local_138._4_4_ * fVar2;
    auVar32._8_4_ = local_138._8_4_ * fVar2;
    auVar32._12_4_ = local_138._12_4_ * fVar2;
    auVar34._0_4_ = local_138._0_4_ * fVar3;
    auVar34._4_4_ = local_138._4_4_ * fVar3;
    auVar34._8_4_ = local_138._8_4_ * fVar3;
    auVar34._12_4_ = local_138._12_4_ * fVar3;
    auVar28 = vsubps_avx(auVar36,auVar25);
    auVar36 = vsubps_avx(auVar21,auVar32);
    auVar21 = vsubps_avx(auVar29,auVar34);
    auVar26._0_4_ =
         auVar28._0_4_ * auVar28._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar21._0_4_ * auVar21._0_4_;
    auVar26._4_4_ =
         auVar28._4_4_ * auVar28._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar21._4_4_ * auVar21._4_4_;
    auVar26._8_4_ =
         auVar28._8_4_ * auVar28._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar21._8_4_ * auVar21._8_4_;
    auVar26._12_4_ =
         auVar28._12_4_ * auVar28._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar21._12_4_ * auVar21._12_4_;
    auVar21._0_4_ = fVar20 * fVar20;
    auVar21._4_4_ = fVar22 * fVar22;
    auVar21._8_4_ = fVar23 * fVar23;
    auVar21._12_4_ = fVar24 * fVar24;
    auVar28 = vcmpps_avx(auVar26,auVar21,2);
    auVar36 = auVar27 & auVar28;
    if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0')
    {
      auVar27 = vandps_avx(auVar27,auVar28);
      auVar33._0_4_ = fVar35 * fVar35 + fVar43 * fVar43 + fVar53 * fVar53;
      auVar33._4_4_ = fVar39 * fVar39 + fVar45 * fVar45 + fVar55 * fVar55;
      auVar33._8_4_ = fVar40 * fVar40 + fVar46 * fVar46 + fVar56 * fVar56;
      auVar33._12_4_ = fVar41 * fVar41 + fVar47 * fVar47 + fVar57 * fVar57;
      auVar28 = vcmpps_avx(auVar33,auVar21,6);
      auVar36 = auVar28 & auVar27;
      if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0'
         ) {
        local_1d8 = vandps_avx(auVar27,auVar28);
        auVar21 = ZEXT816(0);
        local_158 = ZEXT1632(auVar21);
        local_128[0] = -fVar1;
        local_128[1] = -fVar1;
        local_128[2] = -fVar1;
        local_128[3] = -fVar1;
        local_118[0] = -fVar2;
        local_118[1] = -fVar2;
        local_118[2] = -fVar2;
        local_118[3] = -fVar2;
        local_108[0] = -fVar3;
        local_108[1] = -fVar3;
        local_108[2] = -fVar3;
        local_108[3] = -fVar3;
        auVar37._8_4_ = 0x7f800000;
        auVar37._0_8_ = 0x7f8000007f800000;
        auVar37._12_4_ = 0x7f800000;
        auVar38 = ZEXT1664(auVar37);
        auVar27 = vblendvps_avx(auVar37,local_138,local_1d8);
        auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
        auVar28 = vminps_avx(auVar28,auVar27);
        auVar36 = vshufpd_avx(auVar28,auVar28,1);
        auVar28 = vminps_avx(auVar36,auVar28);
        auVar28 = vcmpps_avx(auVar27,auVar28,0);
        auVar36 = local_1d8 & auVar28;
        auVar27 = local_1d8;
        if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar36[0xf] < '\0') {
          auVar27 = vandps_avx(auVar28,local_1d8);
        }
        uVar11 = vmovmskps_avx(auVar27);
        lVar15 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        auVar10 = vcmpps_avx(ZEXT1632(auVar21),ZEXT1632(auVar21),0xf);
        auVar42 = ZEXT3264(auVar10);
        auVar44 = ZEXT864(0) << 0x20;
        auVar27 = vpcmpeqd_avx(auVar5,auVar5);
        auVar49 = ZEXT1664(auVar27);
        auVar54 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        do {
          local_1b8 = local_1c8;
          local_198 = &local_e8;
          uVar11 = *(uint *)(local_f8 + lVar15 * 4);
          pRVar13 = (RayHitK<4> *)(ulong)uVar11;
          pGVar7 = (pSVar6->geometries).items[(long)pRVar13].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1d8 + lVar15 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar12 = *(undefined4 *)(local_158 + lVar15 * 4);
              uVar4 = *(undefined4 *)(local_158 + lVar15 * 4 + 0x10);
              *(float *)(ray + k * 4 + 0x80) = local_128[lVar15 + -4];
              *(float *)(ray + k * 4 + 0xc0) = local_128[lVar15];
              *(float *)(ray + k * 4 + 0xd0) = local_118[lVar15];
              *(float *)(ray + k * 4 + 0xe0) = local_108[lVar15];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar12;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar15];
              *(uint *)(ray + k * 4 + 0x120) = uVar11;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_b8 = *(undefined4 *)(local_158 + lVar15 * 4);
            local_a8 = *(undefined4 *)(local_158 + lVar15 * 4 + 0x10);
            local_88 = vpshufd_avx(ZEXT416(uVar11),0);
            local_98 = (Disc->primIDs).field_0.i[lVar15];
            fVar1 = local_128[lVar15];
            local_e8._4_4_ = fVar1;
            local_e8._0_4_ = fVar1;
            local_e8._8_4_ = fVar1;
            local_e8._12_4_ = fVar1;
            fVar1 = local_118[lVar15];
            local_d8._4_4_ = fVar1;
            local_d8._0_4_ = fVar1;
            local_d8._8_4_ = fVar1;
            local_d8._12_4_ = fVar1;
            fVar1 = local_108[lVar15];
            local_c8._4_4_ = fVar1;
            local_c8._0_4_ = fVar1;
            local_c8._8_4_ = fVar1;
            local_c8._12_4_ = fVar1;
            uStack_b4 = local_b8;
            uStack_b0 = local_b8;
            uStack_ac = local_b8;
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_74 = context->user->instID[0];
            local_78 = uStack_74;
            uStack_70 = uStack_74;
            uStack_6c = uStack_74;
            uStack_68 = context->user->instPrimID[0];
            uStack_64 = uStack_68;
            uStack_60 = uStack_68;
            uStack_5c = uStack_68;
            *(float *)(ray + k * 4 + 0x80) = local_128[lVar15 + -4];
            local_1c8 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            local_1b0 = pGVar7->userPtr;
            local_1a8 = context->user;
            local_190 = 4;
            pRVar13 = (RayHitK<4> *)pGVar7->intersectionFilterN;
            local_168 = auVar62._0_16_;
            local_178 = auVar67._0_16_;
            local_58 = auVar42._0_32_;
            local_188 = auVar54._0_16_;
            local_1a0 = ray;
            if (pRVar13 != (RayHitK<4> *)0x0) {
              auVar27 = auVar49._0_16_;
              pRVar13 = (RayHitK<4> *)(*(code *)pRVar13)(&local_1b8);
              auVar54 = ZEXT1664(local_188);
              auVar27 = vpcmpeqd_avx(auVar27,auVar27);
              auVar49 = ZEXT1664(auVar27);
              auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar42 = ZEXT3264(local_58);
              auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar67 = ZEXT1664(local_178);
              auVar62 = ZEXT1664(local_168);
            }
            auVar27 = auVar49._0_16_;
            if (local_1c8 == (undefined1  [16])0x0) {
              auVar28 = vpcmpeqd_avx(auVar44._0_16_,(undefined1  [16])0x0);
              auVar27 = auVar27 ^ auVar28;
            }
            else {
              pRVar13 = (RayHitK<4> *)context->args->filter;
              if ((pRVar13 != (RayHitK<4> *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                pRVar13 = (RayHitK<4> *)(*(code *)pRVar13)(&local_1b8);
                auVar54 = ZEXT1664(local_188);
                auVar27 = vpcmpeqd_avx(auVar27,auVar27);
                auVar49 = ZEXT1664(auVar27);
                auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar42 = ZEXT3264(local_58);
                auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar67 = ZEXT1664(local_178);
                auVar62 = ZEXT1664(local_168);
              }
              auVar28 = vpcmpeqd_avx(auVar44._0_16_,local_1c8);
              auVar27 = auVar49._0_16_ ^ auVar28;
              if (local_1c8 != (undefined1  [16])0x0) {
                auVar28 = auVar49._0_16_ ^ auVar28;
                auVar5 = vmaskmovps_avx(auVar28,*local_198);
                *(undefined1 (*) [16])(local_1a0 + 0xc0) = auVar5;
                auVar5 = vmaskmovps_avx(auVar28,local_198[1]);
                *(undefined1 (*) [16])(local_1a0 + 0xd0) = auVar5;
                auVar5 = vmaskmovps_avx(auVar28,local_198[2]);
                *(undefined1 (*) [16])(local_1a0 + 0xe0) = auVar5;
                auVar5 = vmaskmovps_avx(auVar28,local_198[3]);
                *(undefined1 (*) [16])(local_1a0 + 0xf0) = auVar5;
                auVar5 = vmaskmovps_avx(auVar28,local_198[4]);
                *(undefined1 (*) [16])(local_1a0 + 0x100) = auVar5;
                auVar5 = vmaskmovps_avx(auVar28,local_198[5]);
                *(undefined1 (*) [16])(local_1a0 + 0x110) = auVar5;
                auVar5 = vmaskmovps_avx(auVar28,local_198[6]);
                *(undefined1 (*) [16])(local_1a0 + 0x120) = auVar5;
                auVar5 = vmaskmovps_avx(auVar28,local_198[7]);
                *(undefined1 (*) [16])(local_1a0 + 0x130) = auVar5;
                auVar28 = vmaskmovps_avx(auVar28,local_198[8]);
                *(undefined1 (*) [16])(local_1a0 + 0x140) = auVar28;
                pRVar13 = local_1a0;
              }
            }
            if ((auVar54._0_16_ & auVar27) == (undefined1  [16])0x0) {
              *(int *)(ray + k * 4 + 0x80) = auVar67._0_4_;
            }
            else {
              auVar67 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_1d8 + lVar15 * 4) = 0;
            auVar27 = vshufps_avx(auVar67._0_16_,auVar67._0_16_,0);
            auVar27 = vcmpps_avx(auVar62._0_16_,auVar27,2);
            local_1d8 = vandps_avx(auVar27,local_1d8);
          }
          if ((((local_1d8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_1d8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_1d8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_1d8[0xf]) {
            return;
          }
          auVar27 = vblendvps_avx(auVar38._0_16_,auVar62._0_16_,local_1d8);
          auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
          auVar28 = vminps_avx(auVar28,auVar27);
          auVar5 = vshufpd_avx(auVar28,auVar28,1);
          auVar28 = vminps_avx(auVar5,auVar28);
          auVar28 = vcmpps_avx(auVar27,auVar28,0);
          auVar5 = local_1d8 & auVar28;
          auVar27 = local_1d8;
          if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar5 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar5[0xf] < '\0') {
            auVar27 = vandps_avx(auVar28,local_1d8);
          }
          uVar12 = vmovmskps_avx(auVar27);
          uVar14 = CONCAT44((int)((ulong)pRVar13 >> 0x20),uVar12);
          lVar15 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }